

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O0

void __thiscall Subscriber::on_error(Subscriber *this,Poll *p,int event)

{
  ostream *poVar1;
  string local_40 [36];
  int local_1c;
  Poll *pPStack_18;
  int event_local;
  Poll *p_local;
  Subscriber *this_local;
  
  local_1c = event;
  pPStack_18 = p;
  p_local = (Poll *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->name);
  poVar1 = std::operator<<(poVar1,": on_error event_code=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  poVar1 = std::operator<<(poVar1," errno=");
  from_errno_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_40);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  Poll::unsubscribe(pPStack_18,this);
  return;
}

Assistant:

void Subscriber::on_error(Poll &p, int event) {
  std::cout << this->name << ": on_error event_code=" << event << " errno=" << from_errno() << std::endl;
  p.unsubscribe(*this);
}